

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# join.hpp
# Opt level: O1

void __thiscall
ranges::
join_view<ranges::zip_with_view<ranges::views::concat_fn,_ranges::transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>_>
::cursor<false>::satisfy(cursor<false> *this)

{
  box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::iter_transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::indirected<ranges::views::single_fn>_>::adaptor<false>_>,_void,_(ranges::detail::box_compress)0>
  bVar1;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> _Var2;
  size_t sVar3;
  vector<double,_std::allocator<double>_> *pvVar4;
  Parent *pPVar5;
  facade_iterator_t<ranges::concat_view<ranges::single_view<double>,_ranges::ref_view<std::vector<double>_>_>_>
  local_30;
  
  pPVar5 = this->rng_;
  _Var2._M_current =
       *(double **)
        &(((_Head_base<0UL,_ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::iter_transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::indirected<ranges::views::single_fn>_>::adaptor<false>_>_>,_false>
            *)((long)&(this->outer_it_).
                      super_iterator_associated_types_base<ranges::iter_zip_with_view<ranges::indirected<ranges::views::concat_fn>,_ranges::transform_view<ranges::ref_view<std::vector<double>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double>_>_>_>::cursor<false>_>
                      .
                      super_readable_iterator_associated_types_base<ranges::iter_zip_with_view<ranges::indirected<ranges::views::concat_fn>,_ranges::transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>::cursor<false>,_void>
                      .
                      super_mixin_base_t<ranges::iter_zip_with_view<ranges::indirected<ranges::views::concat_fn>,_ranges::transform_view<ranges::ref_view<std::vector<double>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double>_>_>_>::cursor<false>_>
                      .
                      super_box<ranges::iter_zip_with_view<ranges::indirected<ranges::views::concat_fn>,_ranges::transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>::cursor<false>,_void,_(ranges::detail::box_compress)0>
                      .value.its_ + 8))->_M_head_impl).
         super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double>_>,_ranges::iter_transform_view<ranges::ref_view<std::vector<double>_>,_ranges::indirected<ranges::views::single_fn>_>::adaptor<false>_>_>
         .
         super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::iter_transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::indirected<ranges::views::single_fn>_>::adaptor<false>_>,_void>
         .
         super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double>_>,_ranges::iter_transform_view<ranges::ref_view<std::vector<double>_>,_ranges::indirected<ranges::views::single_fn>_>::adaptor<false>_>_>
         .
         super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::iter_transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::indirected<ranges::views::single_fn>_>::adaptor<false>_>_>
         .
         super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::iter_transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::indirected<ranges::views::single_fn>_>::adaptor<false>_>,_void,_(ranges::detail::box_compress)0>
         .value;
  if ((_Var2._M_current ==
       (((base_range_t *)
        ((long)&(pPVar5->outer_).
                super_iter_zip_with_view<ranges::indirected<ranges::views::concat_fn>,_ranges::transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                .rngs_.
                super__Tuple_impl<0UL,_ranges::transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                .
                super__Head_base<0UL,_ranges::transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::views::single_fn>,_false>
                ._M_head_impl + 8))->rng_->super__Vector_base<double,_std::allocator<double>_>).
       _M_impl.super__Vector_impl_data._M_finish) ||
     (pvVar4 = (this->outer_it_).
               super_iterator_associated_types_base<ranges::iter_zip_with_view<ranges::indirected<ranges::views::concat_fn>,_ranges::transform_view<ranges::ref_view<std::vector<double>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double>_>_>_>::cursor<false>_>
               .
               super_readable_iterator_associated_types_base<ranges::iter_zip_with_view<ranges::indirected<ranges::views::concat_fn>,_ranges::transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>::cursor<false>,_void>
               .
               super_mixin_base_t<ranges::iter_zip_with_view<ranges::indirected<ranges::views::concat_fn>,_ranges::transform_view<ranges::ref_view<std::vector<double>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double>_>_>_>::cursor<false>_>
               .
               super_box<ranges::iter_zip_with_view<ranges::indirected<ranges::views::concat_fn>,_ranges::transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>::cursor<false>,_void,_(ranges::detail::box_compress)0>
               .value.its_.
               super__Tuple_impl<0UL,_ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::iter_transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::indirected<ranges::views::single_fn>_>::adaptor<false>_>_>,___gnu_cxx::__normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
               .
               super__Tuple_impl<1UL,___gnu_cxx::__normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
               .
               super__Head_base<1UL,___gnu_cxx::__normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>,_false>
               ._M_head_impl._M_current,
     pvVar4 == *(pointer *)
                ((long)&(((pPVar5->outer_).
                          super_iter_zip_with_view<ranges::indirected<ranges::views::concat_fn>,_ranges::transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                          .rngs_.
                          super__Tuple_impl<0UL,_ranges::transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                          .
                          super__Tuple_impl<1UL,_ranges::ref_view<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                          .
                          super__Head_base<1UL,_ranges::ref_view<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>,_false>
                          ._M_head_impl.rng_)->
                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        )._M_impl + 8))) {
    return;
  }
  do {
    (pPVar5->
    super_join_view_inner<ranges::zip_with_view<ranges::views::concat_fn,_ranges::transform_view<ranges::ref_view<std::vector<double>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double>_>_>_>_>
    ).inner_.rngs_.
    super__Tuple_impl<0UL,_ranges::single_view<double>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>
    .super__Head_base<0UL,_ranges::single_view<double>,_false>._M_head_impl.value_ =
         *_Var2._M_current;
    (pPVar5->
    super_join_view_inner<ranges::zip_with_view<ranges::views::concat_fn,_ranges::transform_view<ranges::ref_view<std::vector<double>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double>_>_>_>_>
    ).inner_.rngs_.
    super__Tuple_impl<0UL,_ranges::single_view<double>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>
    .super__Tuple_impl<1UL,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>.
    super__Head_base<1UL,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_false>.
    _M_head_impl.rng_ = pvVar4;
    view_facade<ranges::concat_view<ranges::single_view<double>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_(ranges::cardinality)-1>
    ::
    begin<ranges::concat_view<ranges::single_view<double>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_true,_0>
              (&local_30,
               (view_facade<ranges::concat_view<ranges::single_view<double>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>,_(ranges::cardinality)_1>
                *)&pPVar5->
                   super_join_view_inner<ranges::zip_with_view<ranges::views::concat_fn,_ranges::transform_view<ranges::ref_view<std::vector<double>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double>_>_>_>_>
              );
    (this->inner_it_).
    super_iterator_associated_types_base<ranges::concat_view<ranges::single_view<double>,_ranges::ref_view<std::vector<double>_>_>::cursor<false>_>
    .
    super_readable_iterator_associated_types_base<ranges::concat_view<ranges::single_view<double>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>::cursor<false>,_void>
    .
    super_mixin_base_t<ranges::concat_view<ranges::single_view<double>,_ranges::ref_view<std::vector<double>_>_>::cursor<false>_>
    .
    super_box<ranges::concat_view<ranges::single_view<double>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>::cursor<false>,_void,_(ranges::detail::box_compress)0>
    .value.rng_ = local_30.
                  super_iterator_associated_types_base<ranges::concat_view<ranges::single_view<double>,_ranges::ref_view<std::vector<double>_>_>::cursor<false>_>
                  .
                  super_readable_iterator_associated_types_base<ranges::concat_view<ranges::single_view<double>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>::cursor<false>,_void>
                  .
                  super_mixin_base_t<ranges::concat_view<ranges::single_view<double>,_ranges::ref_view<std::vector<double>_>_>::cursor<false>_>
                  .
                  super_box<ranges::concat_view<ranges::single_view<double>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>::cursor<false>,_void,_(ranges::detail::box_compress)0>
                  .value.rng_;
    if (*(size_t *)
         ((long)&(this->inner_it_).
                 super_iterator_associated_types_base<ranges::concat_view<ranges::single_view<double>,_ranges::ref_view<std::vector<double>_>_>::cursor<false>_>
                 .
                 super_readable_iterator_associated_types_base<ranges::concat_view<ranges::single_view<double>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>::cursor<false>,_void>
                 .
                 super_mixin_base_t<ranges::concat_view<ranges::single_view<double>,_ranges::ref_view<std::vector<double>_>_>::cursor<false>_>
                 .
                 super_box<ranges::concat_view<ranges::single_view<double>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>::cursor<false>,_void,_(ranges::detail::box_compress)0>
                 .value.its_ + 8) != 0xffffffffffffffff) {
      *(size_t *)
       ((long)&(this->inner_it_).
               super_iterator_associated_types_base<ranges::concat_view<ranges::single_view<double>,_ranges::ref_view<std::vector<double>_>_>::cursor<false>_>
               .
               super_readable_iterator_associated_types_base<ranges::concat_view<ranges::single_view<double>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>::cursor<false>,_void>
               .
               super_mixin_base_t<ranges::concat_view<ranges::single_view<double>,_ranges::ref_view<std::vector<double>_>_>::cursor<false>_>
               .
               super_box<ranges::concat_view<ranges::single_view<double>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>::cursor<false>,_void,_(ranges::detail::box_compress)0>
               .value.its_ + 8) = 0xffffffffffffffff;
    }
    if (local_30.
        super_iterator_associated_types_base<ranges::concat_view<ranges::single_view<double>,_ranges::ref_view<std::vector<double>_>_>::cursor<false>_>
        .
        super_readable_iterator_associated_types_base<ranges::concat_view<ranges::single_view<double>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>::cursor<false>,_void>
        .
        super_mixin_base_t<ranges::concat_view<ranges::single_view<double>,_ranges::ref_view<std::vector<double>_>_>::cursor<false>_>
        .
        super_box<ranges::concat_view<ranges::single_view<double>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>::cursor<false>,_void,_(ranges::detail::box_compress)0>
        .value.its_.index_ < 2) {
      *(anon_union_8_2_3194c211_for_type_0 *)
       &(this->inner_it_).
        super_iterator_associated_types_base<ranges::concat_view<ranges::single_view<double>,_ranges::ref_view<std::vector<double>_>_>::cursor<false>_>
        .
        super_readable_iterator_associated_types_base<ranges::concat_view<ranges::single_view<double>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>::cursor<false>,_void>
        .
        super_mixin_base_t<ranges::concat_view<ranges::single_view<double>,_ranges::ref_view<std::vector<double>_>_>::cursor<false>_>
        .
        super_box<ranges::concat_view<ranges::single_view<double>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>::cursor<false>,_void,_(ranges::detail::box_compress)0>
        .value.its_ =
           local_30.
           super_iterator_associated_types_base<ranges::concat_view<ranges::single_view<double>,_ranges::ref_view<std::vector<double>_>_>::cursor<false>_>
           .
           super_readable_iterator_associated_types_base<ranges::concat_view<ranges::single_view<double>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>::cursor<false>,_void>
           .
           super_mixin_base_t<ranges::concat_view<ranges::single_view<double>,_ranges::ref_view<std::vector<double>_>_>::cursor<false>_>
           .
           super_box<ranges::concat_view<ranges::single_view<double>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>::cursor<false>,_void,_(ranges::detail::box_compress)0>
           .value.its_.
           super_variant_data<double_*,___gnu_cxx::__normal_iterator<double_*,_std::vector<double>_>_>
           .field_0;
      sVar3 = local_30.
              super_iterator_associated_types_base<ranges::concat_view<ranges::single_view<double>,_ranges::ref_view<std::vector<double>_>_>::cursor<false>_>
              .
              super_readable_iterator_associated_types_base<ranges::concat_view<ranges::single_view<double>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>::cursor<false>,_void>
              .
              super_mixin_base_t<ranges::concat_view<ranges::single_view<double>,_ranges::ref_view<std::vector<double>_>_>::cursor<false>_>
              .
              super_box<ranges::concat_view<ranges::single_view<double>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>::cursor<false>,_void,_(ranges::detail::box_compress)0>
              .value.its_.index_;
LAB_0012ff88:
      *(size_t *)
       ((long)&(this->inner_it_).
               super_iterator_associated_types_base<ranges::concat_view<ranges::single_view<double>,_ranges::ref_view<std::vector<double>_>_>::cursor<false>_>
               .
               super_readable_iterator_associated_types_base<ranges::concat_view<ranges::single_view<double>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>::cursor<false>,_void>
               .
               super_mixin_base_t<ranges::concat_view<ranges::single_view<double>,_ranges::ref_view<std::vector<double>_>_>::cursor<false>_>
               .
               super_box<ranges::concat_view<ranges::single_view<double>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>::cursor<false>,_void,_(ranges::detail::box_compress)0>
               .value.its_ + 8) = sVar3;
    }
    else {
      sVar3 = 2;
      if (local_30.
          super_iterator_associated_types_base<ranges::concat_view<ranges::single_view<double>,_ranges::ref_view<std::vector<double>_>_>::cursor<false>_>
          .
          super_readable_iterator_associated_types_base<ranges::concat_view<ranges::single_view<double>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>::cursor<false>,_void>
          .
          super_mixin_base_t<ranges::concat_view<ranges::single_view<double>,_ranges::ref_view<std::vector<double>_>_>::cursor<false>_>
          .
          super_box<ranges::concat_view<ranges::single_view<double>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>::cursor<false>,_void,_(ranges::detail::box_compress)0>
          .value.its_.index_ != 0xffffffffffffffff) goto LAB_0012ff88;
    }
    if (*(size_t *)
         ((long)&(this->inner_it_).
                 super_iterator_associated_types_base<ranges::concat_view<ranges::single_view<double>,_ranges::ref_view<std::vector<double>_>_>::cursor<false>_>
                 .
                 super_readable_iterator_associated_types_base<ranges::concat_view<ranges::single_view<double>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>::cursor<false>,_void>
                 .
                 super_mixin_base_t<ranges::concat_view<ranges::single_view<double>,_ranges::ref_view<std::vector<double>_>_>::cursor<false>_>
                 .
                 super_box<ranges::concat_view<ranges::single_view<double>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>::cursor<false>,_void,_(ranges::detail::box_compress)0>
                 .value.its_ + 8) != 1) {
      return;
    }
    if ((this->inner_it_).
        super_iterator_associated_types_base<ranges::concat_view<ranges::single_view<double>,_ranges::ref_view<std::vector<double>_>_>::cursor<false>_>
        .
        super_readable_iterator_associated_types_base<ranges::concat_view<ranges::single_view<double>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>::cursor<false>,_void>
        .
        super_mixin_base_t<ranges::concat_view<ranges::single_view<double>,_ranges::ref_view<std::vector<double>_>_>::cursor<false>_>
        .
        super_box<ranges::concat_view<ranges::single_view<double>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>::cursor<false>,_void,_(ranges::detail::box_compress)0>
        .value.its_.
        super_variant_data<double_*,___gnu_cxx::__normal_iterator<double_*,_std::vector<double>_>_>.
        field_0 !=
        *(anon_union_8_2_3194c211_for_type_0 *)
         ((long)&(((pPVar5->
                   super_join_view_inner<ranges::zip_with_view<ranges::views::concat_fn,_ranges::transform_view<ranges::ref_view<std::vector<double>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double>_>_>_>_>
                   ).inner_.rngs_.
                   super__Tuple_impl<0UL,_ranges::single_view<double>,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>
                   .
                   super__Tuple_impl<1UL,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>_>
                   .
                   super__Head_base<1UL,_ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_false>
                   ._M_head_impl.rng_)->super__Vector_base<double,_std::allocator<double>_>)._M_impl
         + 8)) {
      return;
    }
    bVar1.value.
    super_adaptor_value_type_<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::iter_transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::indirected<ranges::views::single_fn>_>::adaptor<false>,_2>
    .data_.
    super_box<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
    .value._M_current =
         (((_Head_base<0UL,_ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::iter_transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::indirected<ranges::views::single_fn>_>::adaptor<false>_>_>,_false>
            *)((long)&(this->outer_it_).
                      super_iterator_associated_types_base<ranges::iter_zip_with_view<ranges::indirected<ranges::views::concat_fn>,_ranges::transform_view<ranges::ref_view<std::vector<double>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double>_>_>_>::cursor<false>_>
                      .
                      super_readable_iterator_associated_types_base<ranges::iter_zip_with_view<ranges::indirected<ranges::views::concat_fn>,_ranges::transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>::cursor<false>,_void>
                      .
                      super_mixin_base_t<ranges::iter_zip_with_view<ranges::indirected<ranges::views::concat_fn>,_ranges::transform_view<ranges::ref_view<std::vector<double>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double>_>_>_>::cursor<false>_>
                      .
                      super_box<ranges::iter_zip_with_view<ranges::indirected<ranges::views::concat_fn>,_ranges::transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>::cursor<false>,_void,_(ranges::detail::box_compress)0>
                      .value.its_ + 8))->_M_head_impl).
         super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double>_>,_ranges::iter_transform_view<ranges::ref_view<std::vector<double>_>,_ranges::indirected<ranges::views::single_fn>_>::adaptor<false>_>_>
         .
         super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::iter_transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::indirected<ranges::views::single_fn>_>::adaptor<false>_>,_void>
         .
         super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double>_>,_ranges::iter_transform_view<ranges::ref_view<std::vector<double>_>,_ranges::indirected<ranges::views::single_fn>_>::adaptor<false>_>_>
         .
         super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::iter_transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::indirected<ranges::views::single_fn>_>::adaptor<false>_>_>
         .
         super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::iter_transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::indirected<ranges::views::single_fn>_>::adaptor<false>_>,_void,_(ranges::detail::box_compress)0>
         .value;
    (this->outer_it_).
    super_iterator_associated_types_base<ranges::iter_zip_with_view<ranges::indirected<ranges::views::concat_fn>,_ranges::transform_view<ranges::ref_view<std::vector<double>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double>_>_>_>::cursor<false>_>
    .
    super_readable_iterator_associated_types_base<ranges::iter_zip_with_view<ranges::indirected<ranges::views::concat_fn>,_ranges::transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>::cursor<false>,_void>
    .
    super_mixin_base_t<ranges::iter_zip_with_view<ranges::indirected<ranges::views::concat_fn>,_ranges::transform_view<ranges::ref_view<std::vector<double>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double>_>_>_>::cursor<false>_>
    .
    super_box<ranges::iter_zip_with_view<ranges::indirected<ranges::views::concat_fn>,_ranges::transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>::cursor<false>,_void,_(ranges::detail::box_compress)0>
    .value.its_.
    super__Tuple_impl<0UL,_ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::iter_transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::indirected<ranges::views::single_fn>_>::adaptor<false>_>_>,___gnu_cxx::__normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
    .
    super__Tuple_impl<1UL,___gnu_cxx::__normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
    .
    super__Head_base<1UL,___gnu_cxx::__normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>,_false>
    ._M_head_impl._M_current =
         (this->outer_it_).
         super_iterator_associated_types_base<ranges::iter_zip_with_view<ranges::indirected<ranges::views::concat_fn>,_ranges::transform_view<ranges::ref_view<std::vector<double>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double>_>_>_>::cursor<false>_>
         .
         super_readable_iterator_associated_types_base<ranges::iter_zip_with_view<ranges::indirected<ranges::views::concat_fn>,_ranges::transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>::cursor<false>,_void>
         .
         super_mixin_base_t<ranges::iter_zip_with_view<ranges::indirected<ranges::views::concat_fn>,_ranges::transform_view<ranges::ref_view<std::vector<double>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double>_>_>_>::cursor<false>_>
         .
         super_box<ranges::iter_zip_with_view<ranges::indirected<ranges::views::concat_fn>,_ranges::transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>::cursor<false>,_void,_(ranges::detail::box_compress)0>
         .value.its_.
         super__Tuple_impl<0UL,_ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::iter_transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::indirected<ranges::views::single_fn>_>::adaptor<false>_>_>,___gnu_cxx::__normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
         .
         super__Tuple_impl<1UL,___gnu_cxx::__normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
         .
         super__Head_base<1UL,___gnu_cxx::__normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>,_false>
         ._M_head_impl._M_current + 1;
    (((_Head_base<0UL,_ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::iter_transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::indirected<ranges::views::single_fn>_>::adaptor<false>_>_>,_false>
       *)((long)&(this->outer_it_).
                 super_iterator_associated_types_base<ranges::iter_zip_with_view<ranges::indirected<ranges::views::concat_fn>,_ranges::transform_view<ranges::ref_view<std::vector<double>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double>_>_>_>::cursor<false>_>
                 .
                 super_readable_iterator_associated_types_base<ranges::iter_zip_with_view<ranges::indirected<ranges::views::concat_fn>,_ranges::transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>::cursor<false>,_void>
                 .
                 super_mixin_base_t<ranges::iter_zip_with_view<ranges::indirected<ranges::views::concat_fn>,_ranges::transform_view<ranges::ref_view<std::vector<double>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double>_>_>_>::cursor<false>_>
                 .
                 super_box<ranges::iter_zip_with_view<ranges::indirected<ranges::views::concat_fn>,_ranges::transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>::cursor<false>,_void,_(ranges::detail::box_compress)0>
                 .value.its_ + 8))->_M_head_impl).
    super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double>_>,_ranges::iter_transform_view<ranges::ref_view<std::vector<double>_>,_ranges::indirected<ranges::views::single_fn>_>::adaptor<false>_>_>
    .
    super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::iter_transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::indirected<ranges::views::single_fn>_>::adaptor<false>_>,_void>
    .
    super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double>_>,_ranges::iter_transform_view<ranges::ref_view<std::vector<double>_>,_ranges::indirected<ranges::views::single_fn>_>::adaptor<false>_>_>
    .
    super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::iter_transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::indirected<ranges::views::single_fn>_>::adaptor<false>_>_>
    .
    super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::iter_transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::indirected<ranges::views::single_fn>_>::adaptor<false>_>,_void,_(ranges::detail::box_compress)0>
    .value = (adaptor_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::iter_transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::indirected<ranges::views::single_fn>_>::adaptor<false>_>
              )((long)bVar1.value.
                      super_adaptor_value_type_<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::iter_transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::indirected<ranges::views::single_fn>_>::adaptor<false>,_2>
                      .data_.
                      super_box<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
                      .value._M_current + 8);
    pPVar5 = this->rng_;
    _Var2._M_current =
         *(double **)
          &(((_Head_base<0UL,_ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::iter_transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::indirected<ranges::views::single_fn>_>::adaptor<false>_>_>,_false>
              *)((long)&(this->outer_it_).
                        super_iterator_associated_types_base<ranges::iter_zip_with_view<ranges::indirected<ranges::views::concat_fn>,_ranges::transform_view<ranges::ref_view<std::vector<double>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double>_>_>_>::cursor<false>_>
                        .
                        super_readable_iterator_associated_types_base<ranges::iter_zip_with_view<ranges::indirected<ranges::views::concat_fn>,_ranges::transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>::cursor<false>,_void>
                        .
                        super_mixin_base_t<ranges::iter_zip_with_view<ranges::indirected<ranges::views::concat_fn>,_ranges::transform_view<ranges::ref_view<std::vector<double>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double>_>_>_>::cursor<false>_>
                        .
                        super_box<ranges::iter_zip_with_view<ranges::indirected<ranges::views::concat_fn>,_ranges::transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>::cursor<false>,_void,_(ranges::detail::box_compress)0>
                        .value.its_ + 8))->_M_head_impl).
           super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double>_>,_ranges::iter_transform_view<ranges::ref_view<std::vector<double>_>,_ranges::indirected<ranges::views::single_fn>_>::adaptor<false>_>_>
           .
           super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::iter_transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::indirected<ranges::views::single_fn>_>::adaptor<false>_>,_void>
           .
           super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double>_>,_ranges::iter_transform_view<ranges::ref_view<std::vector<double>_>,_ranges::indirected<ranges::views::single_fn>_>::adaptor<false>_>_>
           .
           super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::iter_transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::indirected<ranges::views::single_fn>_>::adaptor<false>_>_>
           .
           super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::iter_transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::indirected<ranges::views::single_fn>_>::adaptor<false>_>,_void,_(ranges::detail::box_compress)0>
           .value;
    if (_Var2._M_current ==
        (((base_range_t *)
         ((long)&(pPVar5->outer_).
                 super_iter_zip_with_view<ranges::indirected<ranges::views::concat_fn>,_ranges::transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                 .rngs_.
                 super__Tuple_impl<0UL,_ranges::transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                 .
                 super__Head_base<0UL,_ranges::transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::views::single_fn>,_false>
                 ._M_head_impl + 8))->rng_->super__Vector_base<double,_std::allocator<double>_>).
        _M_impl.super__Vector_impl_data._M_finish) {
      return;
    }
    pvVar4 = (this->outer_it_).
             super_iterator_associated_types_base<ranges::iter_zip_with_view<ranges::indirected<ranges::views::concat_fn>,_ranges::transform_view<ranges::ref_view<std::vector<double>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double>_>_>_>::cursor<false>_>
             .
             super_readable_iterator_associated_types_base<ranges::iter_zip_with_view<ranges::indirected<ranges::views::concat_fn>,_ranges::transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>::cursor<false>,_void>
             .
             super_mixin_base_t<ranges::iter_zip_with_view<ranges::indirected<ranges::views::concat_fn>,_ranges::transform_view<ranges::ref_view<std::vector<double>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double>_>_>_>::cursor<false>_>
             .
             super_box<ranges::iter_zip_with_view<ranges::indirected<ranges::views::concat_fn>,_ranges::transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>::cursor<false>,_void,_(ranges::detail::box_compress)0>
             .value.its_.
             super__Tuple_impl<0UL,_ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::iter_transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::indirected<ranges::views::single_fn>_>::adaptor<false>_>_>,___gnu_cxx::__normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
             .
             super__Tuple_impl<1UL,___gnu_cxx::__normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
             .
             super__Head_base<1UL,___gnu_cxx::__normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>,_false>
             ._M_head_impl._M_current;
    if (pvVar4 == *(pointer *)
                   ((long)&(((pPVar5->outer_).
                             super_iter_zip_with_view<ranges::indirected<ranges::views::concat_fn>,_ranges::transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                             .rngs_.
                             super__Tuple_impl<0UL,_ranges::transform_view<ranges::ref_view<std::vector<double,_std::allocator<double>_>_>,_ranges::views::single_fn>,_ranges::ref_view<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                             .
                             super__Tuple_impl<1UL,_ranges::ref_view<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                             .
                             super__Head_base<1UL,_ranges::ref_view<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>,_false>
                             ._M_head_impl.rng_)->
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           )._M_impl + 8)) {
      return;
    }
  } while( true );
}

Assistant:

void satisfy()
            {
                for(; outer_it_ != ranges::end(rng_->outer_); ++outer_it_)
                {
                    auto & inner = rng_->update_inner_(*outer_it_);
                    inner_it_ = ranges::begin(inner);
                    if(inner_it_ != ranges::end(inner))
                        return;
                }
                if(RANGES_CONSTEXPR_IF(ref_is_glvalue::value))
                    inner_it_ = iterator_t<CInner>();
            }